

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O3

uint32_t VP8LPredictor11_C(uint32_t *left,uint32_t *top)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  uVar1 = top[-1];
  uVar2 = *top;
  uVar3 = *left;
  iVar6 = (uVar3 >> 0x18) - (uVar1 >> 0x18);
  iVar7 = (uVar2 >> 0x18) - (uVar1 >> 0x18);
  iVar4 = -iVar6;
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  iVar6 = -iVar7;
  if (0 < iVar7) {
    iVar6 = iVar7;
  }
  uVar8 = uVar1 >> 0x10 & 0xff;
  iVar9 = (uVar3 >> 0x10 & 0xff) - uVar8;
  iVar10 = (uVar2 >> 0x10 & 0xff) - uVar8;
  iVar7 = -iVar9;
  if (0 < iVar9) {
    iVar7 = iVar9;
  }
  iVar9 = -iVar10;
  if (0 < iVar10) {
    iVar9 = iVar10;
  }
  uVar8 = uVar1 >> 8 & 0xff;
  iVar5 = (uVar3 >> 8 & 0xff) - uVar8;
  iVar11 = (uVar2 >> 8 & 0xff) - uVar8;
  iVar10 = -iVar5;
  if (0 < iVar5) {
    iVar10 = iVar5;
  }
  iVar5 = -iVar11;
  if (0 < iVar11) {
    iVar5 = iVar11;
  }
  iVar13 = (uVar3 & 0xff) - (uVar1 & 0xff);
  iVar12 = (uVar2 & 0xff) - (uVar1 & 0xff);
  iVar11 = -iVar13;
  if (0 < iVar13) {
    iVar11 = iVar13;
  }
  iVar13 = -iVar12;
  if (0 < iVar12) {
    iVar13 = iVar12;
  }
  iVar4 = (iVar11 + iVar4 + iVar10) - (iVar13 + iVar6 + iVar5 + iVar9);
  iVar6 = iVar4 + iVar7;
  if (iVar6 == 0 || SCARRY4(iVar4,iVar7) != iVar6 < 0) {
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

uint32_t VP8LPredictor11_C(const uint32_t* const left,
                           const uint32_t* const top) {
  const uint32_t pred = Select(top[0], *left, top[-1]);
  return pred;
}